

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitXorOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  char *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  idx_t iVar5;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    puVar4 = *(undefined8 **)(result + 0x20);
    local_48.result_idx = 0;
    pcVar1 = (char *)**(undefined8 **)(states + 0x20);
    if (*pcVar1 == '\0') {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      *puVar4 = *(undefined8 *)(pcVar1 + 8);
      puVar4[1] = uVar3;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar2 = *(long *)(states + 0x20);
    if (count != 0) {
      puVar4 = (undefined8 *)(*(long *)(result + 0x20) + offset * 0x10);
      iVar5 = 0;
      do {
        local_48.result_idx = offset + iVar5;
        pcVar1 = *(char **)(lVar2 + iVar5 * 8);
        if (*pcVar1 == '\0') {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          uVar3 = *(undefined8 *)(pcVar1 + 0x10);
          *puVar4 = *(undefined8 *)(pcVar1 + 8);
          puVar4[1] = uVar3;
        }
        iVar5 = iVar5 + 1;
        puVar4 = puVar4 + 2;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}